

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O2

void __thiscall
module_reverse_csv_actions::from_header(module_reverse_csv_actions *this,string *header)

{
  if (this->first_header_ == true) {
    this->first_header_ = false;
  }
  else {
    std::operator<<((ostream *)&std::cout,' ');
  }
  std::operator<<((ostream *)&std::cout,(string *)header);
  return;
}

Assistant:

void from_header( std::string const & header )
    {
        if( first_header_ )
            first_header_ = false;
        else
            std::cout << ' ';
        std::cout << header;
    }